

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError Pa_Initialize(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  PaUtilHostApiRepresentation *pPVar4;
  int iVar5;
  PaUtilHostApiRepresentation **ppPVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  
  if (initializationCount_ != 0) {
    initializationCount_ = initializationCount_ + 1;
    return 0;
  }
  PaUtil_InitializeClock();
  uVar8 = 0xffffffffffffffff;
  lVar10 = -0x100000000;
  do {
    lVar10 = lVar10 + 0x100000000;
    lVar1 = uVar8 * 8;
    uVar8 = uVar8 + 1;
  } while (*(long *)(__gmon_start__ + lVar1) != 0);
  ppPVar6 = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar10 >> 0x1d);
  hostApis_ = ppPVar6;
  if (ppPVar6 == (PaUtilHostApiRepresentation **)0x0) {
    iVar5 = -0x2708;
LAB_00104d21:
    TerminateHostApis();
    return iVar5;
  }
  uVar7 = 0;
  hostApisCount_ = 0;
  defaultHostApiIndex_ = -1;
  deviceCount_ = 0;
  if (uVar8 != 0) {
    uVar11 = 1;
    if (1 < (int)uVar8) {
      uVar11 = uVar8 & 0xffffffff;
    }
    uVar8 = 0;
    iVar9 = 0;
    do {
      ppPVar6[(int)uVar7] = (PaUtilHostApiRepresentation *)0x0;
      iVar5 = (**(code **)(&paHostApiInitializers + uVar8 * 8))();
      ppPVar6 = hostApis_;
      if (iVar5 != 0) goto LAB_00104d21;
      uVar7 = (ulong)hostApisCount_;
      pPVar4 = hostApis_[uVar7];
      if (pPVar4 != (PaUtilHostApiRepresentation *)0x0) {
        iVar5 = (pPVar4->info).deviceCount;
        uVar2 = (pPVar4->info).defaultInputDevice;
        if (iVar5 <= (int)uVar2) {
          __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                        ,0xc4,"PaError InitializeHostApis(void)");
        }
        uVar3 = (pPVar4->info).defaultOutputDevice;
        if (iVar5 <= (int)uVar3) {
          __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                        ,0xc5,"PaError InitializeHostApis(void)");
        }
        if (defaultHostApiIndex_ == -1) {
          if ((uVar3 & uVar2) != 0xffffffff) {
            defaultHostApiIndex_ = hostApisCount_;
            goto LAB_00104cba;
          }
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
        }
        else {
LAB_00104cba:
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
          if (uVar2 != 0xffffffff) {
            (pPVar4->info).defaultInputDevice = uVar2 + iVar9;
          }
          if (uVar3 != 0xffffffff) {
            (pPVar4->info).defaultOutputDevice = uVar3 + iVar9;
          }
        }
        deviceCount_ = deviceCount_ + iVar5;
        iVar9 = iVar9 + iVar5;
        hostApisCount_ = hostApisCount_ + 1;
        uVar7 = (ulong)(uint)hostApisCount_;
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
    if (defaultHostApiIndex_ != -1) goto LAB_00104d0e;
  }
  defaultHostApiIndex_ = 0;
LAB_00104d0e:
  initializationCount_ = initializationCount_ + 1;
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;
        
        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}